

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2boolean_operation.cc
# Opt level: O1

bool __thiscall
S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex
          (CrossingProcessor *this,S2Point *v,CrossingIterator *it)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  int iVar4;
  IndexCrossing *pIVar5;
  ChainInfo *pCVar6;
  long lVar7;
  double *ap;
  bool bVar8;
  S2LogMessage local_a0;
  double local_88 [3];
  S2LogMessage local_70;
  undefined1 local_60 [24];
  double local_48;
  double adStack_40 [2];
  
  if (it->b_dimension_ != 1) {
    S2LogMessage::S2LogMessage
              (&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x687,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_a0.stream_,"Check failed: (1) == (it.b_dimension()) ",0x28);
LAB_001a05a0:
    abort();
  }
  (*it->b_shape_->_vptr_S2Shape[3])
            (&local_a0,it->b_shape_,(ulong)(uint)(((it->it_)._M_current)->b).edge_id);
  if (((double)local_a0._0_8_ == v->c_[0]) && (!NAN((double)local_a0._0_8_) && !NAN(v->c_[0]))) {
    lVar7 = 0;
    do {
      if (lVar7 == 0x10) {
        bVar8 = false;
        goto LAB_001a0419;
      }
      dVar3 = *(double *)((long)&local_a0.stream_ + lVar7);
      pdVar1 = (double *)((long)v->c_ + lVar7 + 8);
      lVar7 = lVar7 + 8;
    } while ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1)));
  }
  (*it->b_shape_->_vptr_S2Shape[3])
            (local_60,it->b_shape_,(ulong)(uint)(((it->it_)._M_current)->b).edge_id);
  if ((local_48 != v->c_[0]) || (NAN(local_48) || NAN(v->c_[0]))) {
    bVar8 = true;
  }
  else {
    lVar7 = 0;
    do {
      bVar8 = lVar7 == 0x10;
      if (bVar8) goto LAB_001a040c;
      pdVar1 = (double *)((long)adStack_40 + lVar7);
      pdVar2 = (double *)((long)v->c_ + lVar7 + 8);
      lVar7 = lVar7 + 8;
    } while ((*pdVar1 == *pdVar2) && (!NAN(*pdVar1) && !NAN(*pdVar2)));
    bVar8 = false;
LAB_001a040c:
    bVar8 = (bool)(bVar8 ^ 1);
  }
LAB_001a0419:
  if (bVar8) {
    S2LogMessage::S2LogMessage
              (&local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2boolean_operation.cc"
               ,0x688,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_70.stream_,"Check failed: it.b_edge().v0 == v || it.b_edge().v1 == v ",0x39);
    if (bVar8) goto LAB_001a05a0;
  }
  if (this->polyline_model_ == CLOSED) {
    return true;
  }
  pCVar6 = CrossingIterator::b_chain_info(it);
  pIVar5 = (it->it_)._M_current;
  iVar4 = (pIVar5->b).edge_id;
  if (pCVar6->limit + -1 == iVar4) {
    (*it->b_shape_->_vptr_S2Shape[3])(&local_a0,it->b_shape_,(ulong)(uint)(pIVar5->b).edge_id);
    if ((v->c_[0] == local_88[0]) && (!NAN(v->c_[0]) && !NAN(local_88[0]))) {
      lVar7 = 8;
      do {
        if (lVar7 == 0x18) {
          return false;
        }
        dVar3 = *(double *)((long)v->c_ + lVar7);
        pdVar1 = (double *)((long)local_88 + lVar7);
        lVar7 = lVar7 + 8;
      } while ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1)));
    }
  }
  if (pCVar6->start < iVar4) {
    return true;
  }
  if (this->polyline_model_ != OPEN) {
    return true;
  }
  (*it->b_shape_->_vptr_S2Shape[3])
            (&local_a0,it->b_shape_,(ulong)(uint)(((it->it_)._M_current)->b).edge_id);
  if (v->c_[0] == (double)local_a0._0_8_) {
    if (NAN(v->c_[0]) || NAN((double)local_a0._0_8_)) {
      return true;
    }
    lVar7 = 8;
    do {
      if (lVar7 == 0x18) {
        if (this->polyline_loops_have_boundaries_ == false) {
          (*it->b_shape_->_vptr_S2Shape[8])
                    (&local_a0,it->b_shape_,(ulong)(uint)pCVar6->chain_id,
                     (ulong)(uint)(~pCVar6->start + pCVar6->limit));
          if ((v->c_[0] == local_88[0]) && (!NAN(v->c_[0]) && !NAN(local_88[0]))) {
            lVar7 = 0;
            do {
              if (lVar7 == 0x10) {
                return lVar7 == 0x10;
              }
              dVar3 = *(double *)((long)v->c_ + lVar7 + 8);
              pdVar1 = (double *)((long)local_88 + lVar7 + 8);
              lVar7 = lVar7 + 8;
            } while ((dVar3 == *pdVar1) && (!NAN(dVar3) && !NAN(*pdVar1)));
          }
        }
        return false;
      }
      dVar3 = *(double *)((long)v->c_ + lVar7);
      pdVar1 = (double *)((long)&local_a0.severity_ + lVar7);
      lVar7 = lVar7 + 8;
      if (dVar3 != *pdVar1) {
        return true;
      }
    } while (!NAN(dVar3) && !NAN(*pdVar1));
    return true;
  }
  return true;
}

Assistant:

bool S2BooleanOperation::Impl::CrossingProcessor::PolylineEdgeContainsVertex(
    const S2Point& v, const CrossingIterator& it) const {
  S2_DCHECK_EQ(1, it.b_dimension());
  S2_DCHECK(it.b_edge().v0 == v || it.b_edge().v1 == v);

  // Closed polylines contain all their vertices.
  if (polyline_model_ == PolylineModel::CLOSED) return true;

  // Note that the code below is structured so that it.b_edge() is not usually
  // needed (since accessing the edge can be relatively expensive).
  const auto& b_chain = it.b_chain_info();
  int b_edge_id = it.b_edge_id();

  // The last polyline vertex is never contained.  (For polyline loops, it is
  // sufficient to treat the first vertex as begin contained.)  This case also
  // handles degenerate polylines (polylines with one edge where v0 == v1),
  // which do not contain any points.
  if (b_edge_id == b_chain.limit - 1 && v == it.b_edge().v1) return false;

  // Otherwise all interior vertices are contained.  The first polyline
  // vertex is contained if either the polyline model is not OPEN, or the
  // polyline forms a loop and polyline_loops_have_boundaries_ is false.
  if (polyline_contains_v0(b_edge_id, b_chain.start)) return true;
  if (v != it.b_edge().v0) return true;
  if (polyline_loops_have_boundaries_) return false;
  return v == it.b_shape().chain_edge(b_chain.chain_id,
                                      b_chain.limit - b_chain.start - 1).v1;
}